

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineCacheTests.cpp
# Opt level: O0

void __thiscall
vkt::pipeline::anon_unknown_0::PipelineFromCacheTestInstance::PipelineFromCacheTestInstance
          (PipelineFromCacheTestInstance *this,Context *context,CacheTestParam *param)

{
  VkRenderPass renderPass;
  VkPipelineCache cache;
  RefData<vk::Handle<(vk::HandleType)15>_> data;
  RefData<vk::Handle<(vk::HandleType)18>_> data_00;
  size_t sVar1;
  VkDevice pVVar2;
  VkResult VVar3;
  VkDevice pVVar4;
  Handle<(vk::HandleType)15> *pHVar5;
  deUint8 *pdVar6;
  Handle<(vk::HandleType)17> *pHVar7;
  Handle<(vk::HandleType)16> *pHVar8;
  Vector<unsigned_int,_2> local_108;
  Move<vk::Handle<(vk::HandleType)18>_> local_100;
  RefData<vk::Handle<(vk::HandleType)18>_> local_e0;
  Move<vk::Handle<(vk::HandleType)15>_> local_c0;
  RefData<vk::Handle<(vk::HandleType)15>_> local_a0;
  undefined1 local_80 [8];
  VkPipelineCacheCreateInfo pipelineCacheCreateInfo;
  ulong local_48;
  size_t dataSize;
  VkDevice vkDevice;
  DeviceInterface *vk;
  CacheTestParam *local_20;
  CacheTestParam *param_local;
  Context *context_local;
  PipelineFromCacheTestInstance *this_local;
  
  local_20 = param;
  param_local = (CacheTestParam *)context;
  context_local = (Context *)this;
  GraphicsCacheTestInstance::GraphicsCacheTestInstance
            (&this->super_GraphicsCacheTestInstance,context,param);
  (this->super_GraphicsCacheTestInstance).super_CacheTestInstance.super_TestInstance.
  _vptr_TestInstance = (_func_int **)&PTR__PipelineFromCacheTestInstance_0165fdb0;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)15>_>::Move(&this->m_newCache);
  this->m_data = (deUint8 *)0x0;
  vkDevice = (VkDevice)
             Context::getDeviceInterface
                       ((this->super_GraphicsCacheTestInstance).super_CacheTestInstance.
                        super_TestInstance.m_context);
  pVVar4 = Context::getDevice((this->super_GraphicsCacheTestInstance).super_CacheTestInstance.
                              super_TestInstance.m_context);
  pVVar2 = vkDevice;
  local_48 = 0;
  dataSize = (size_t)pVVar4;
  pHVar5 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)15>_>::operator*
                     (&(this->super_GraphicsCacheTestInstance).super_CacheTestInstance.m_cache.
                       super_RefBase<vk::Handle<(vk::HandleType)15>_>);
  VVar3 = (**(code **)(*(long *)pVVar2 + 0x170))(pVVar2,pVVar4,pHVar5->m_internal,&local_48,0);
  ::vk::checkResult(VVar3,
                    "vk.getPipelineCacheData(vkDevice, *m_cache, (deUintptr*)&dataSize, DE_NULL)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineCacheTests.cpp"
                    ,0x5cd);
  pdVar6 = (deUint8 *)operator_new__(local_48);
  pVVar2 = vkDevice;
  sVar1 = dataSize;
  this->m_data = pdVar6;
  pHVar5 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)15>_>::operator*
                     (&(this->super_GraphicsCacheTestInstance).super_CacheTestInstance.m_cache.
                       super_RefBase<vk::Handle<(vk::HandleType)15>_>);
  pipelineCacheCreateInfo.pInitialData = (void *)pHVar5->m_internal;
  VVar3 = (**(code **)(*(long *)pVVar2 + 0x170))
                    (pVVar2,sVar1,pipelineCacheCreateInfo.pInitialData,&local_48,this->m_data);
  ::vk::checkResult(VVar3,
                    "vk.getPipelineCacheData(vkDevice, *m_cache, (deUintptr*)&dataSize, (void*)m_data)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineCacheTests.cpp"
                    ,0x5d1);
  local_80._0_4_ = VK_STRUCTURE_TYPE_PIPELINE_CACHE_CREATE_INFO;
  pipelineCacheCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  pipelineCacheCreateInfo._4_4_ = 0;
  pipelineCacheCreateInfo.pNext._0_4_ = 0;
  pipelineCacheCreateInfo._16_8_ = local_48;
  pipelineCacheCreateInfo.initialDataSize = (deUintptr)this->m_data;
  ::vk::createPipelineCache
            (&local_c0,(DeviceInterface *)vkDevice,(VkDevice)dataSize,
             (VkPipelineCacheCreateInfo *)local_80,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_a0,(Move *)&local_c0);
  data.deleter.m_deviceIface = local_a0.deleter.m_deviceIface;
  data.object.m_internal = local_a0.object.m_internal;
  data.deleter.m_device = local_a0.deleter.m_device;
  data.deleter.m_allocator = local_a0.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)15>_>::operator=(&this->m_newCache,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)15>_>::~Move(&local_c0);
  tcu::Vector<unsigned_int,_2>::Vector
            (&local_108,&(this->super_GraphicsCacheTestInstance).m_renderSize);
  pHVar7 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::operator*
                     (&(this->super_GraphicsCacheTestInstance).m_renderPass.
                       super_RefBase<vk::Handle<(vk::HandleType)17>_>);
  renderPass.m_internal = pHVar7->m_internal;
  pHVar5 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)15>_>::operator*
                     (&(this->m_newCache).super_RefBase<vk::Handle<(vk::HandleType)15>_>);
  cache.m_internal = pHVar5->m_internal;
  pHVar8 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                     (&(this->super_GraphicsCacheTestInstance).m_pipelineLayout.
                       super_RefBase<vk::Handle<(vk::HandleType)16>_>);
  SimpleGraphicsPipelineBuilder::buildPipeline
            (&local_100,
             (SimpleGraphicsPipelineBuilder *)
             &(this->super_GraphicsCacheTestInstance).m_pipelineBuilder,&local_108,renderPass,cache,
             (VkPipelineLayout)pHVar8->m_internal);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_e0,(Move *)&local_100);
  data_00.deleter.m_deviceIface = local_e0.deleter.m_deviceIface;
  data_00.object.m_internal = local_e0.object.m_internal;
  data_00.deleter.m_device = local_e0.deleter.m_device;
  data_00.deleter.m_allocator = local_e0.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::operator=
            ((this->super_GraphicsCacheTestInstance).m_pipeline + 1,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::~Move(&local_100);
  return;
}

Assistant:

PipelineFromCacheTestInstance::PipelineFromCacheTestInstance (Context& context, const CacheTestParam* param)
	: GraphicsCacheTestInstance	(context, param)
	, m_data					(DE_NULL)
{
	const DeviceInterface&  vk = m_context.getDeviceInterface();
	const VkDevice          vkDevice = m_context.getDevice();

	// Create more pipeline caches
	{
		size_t  dataSize	= 0u;

		VK_CHECK(vk.getPipelineCacheData(vkDevice, *m_cache, (deUintptr*)&dataSize, DE_NULL));

		m_data				= new deUint8[dataSize];
		DE_ASSERT(m_data);
		VK_CHECK(vk.getPipelineCacheData(vkDevice, *m_cache, (deUintptr*)&dataSize, (void*)m_data));

		const VkPipelineCacheCreateInfo pipelineCacheCreateInfo =
		{
			VK_STRUCTURE_TYPE_PIPELINE_CACHE_CREATE_INFO,           // VkStructureType             sType;
			DE_NULL,                                                // const void*                 pNext;
			0u,                                                     // VkPipelineCacheCreateFlags  flags;
			dataSize,                                               // deUintptr                   initialDataSize;
			m_data,                                                 // const void*                 pInitialData;
		};
		m_newCache = createPipelineCache(vk, vkDevice, &pipelineCacheCreateInfo);
	}
	m_pipeline[PIPELINE_CACHE_NDX_CACHED] = m_pipelineBuilder.buildPipeline(m_renderSize, *m_renderPass, *m_newCache, *m_pipelineLayout);
}